

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDF::readTrailer(QPDF *this)

{
  InputSource *input;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  bool bVar2;
  qpdf_offset_t offset;
  qpdf_offset_t offset_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDF *in_RSI;
  QPDFObjectHandle QVar3;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  pair<QPDFObjectHandle,_bool> local_c8;
  QPDFExc local_b0;
  
  offset = (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  input = (((in_RSI->m)._M_t.
            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"trailer",(allocator<char> *)&local_108);
  _Var1._M_head_impl =
       (in_RSI->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFParser::parse(&local_c8,input,(string *)&local_b0,&(_Var1._M_head_impl)->tokenizer,
                    (StringDecrypter *)0x0,in_RSI,(_Var1._M_head_impl)->in_xref_reconstruction);
  std::__cxx11::string::~string((string *)&local_b0);
  if (local_c8.second == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"trailer",&local_109);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"empty object treated as null",&local_10a);
    damagedPDF(&local_b0,in_RSI,&local_108,&local_e8);
    warn(in_RSI,&local_b0);
  }
  else {
    bVar2 = QPDFObjectHandle::isDictionary(&local_c8.first);
    if (!bVar2) goto LAB_001e0b25;
    readToken((Token *)&local_b0,in_RSI,
              (((in_RSI->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"stream",(allocator<char> *)&local_e8);
    bVar2 = QPDFTokenizer::Token::isWord((Token *)&local_b0,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    QPDFTokenizer::Token::~Token((Token *)&local_b0);
    if (!bVar2) goto LAB_001e0b25;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"trailer",&local_109);
    offset_00 = (**(code **)(**(long **)&(((in_RSI->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x20))();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"stream keyword found in trailer",&local_10a);
    damagedPDF(&local_b0,in_RSI,&local_108,offset_00,&local_e8);
    warn(in_RSI,&local_b0);
  }
  QPDFExc::~QPDFExc(&local_b0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
LAB_001e0b25:
  InputSource::setLastOffset
            ((((in_RSI->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,offset);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.first.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readTrailer()
{
    qpdf_offset_t offset = m->file->tell();
    auto [object, empty] = QPDFParser::parse(
        *m->file, "trailer", m->tokenizer, nullptr, *this, m->in_xref_reconstruction);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(damagedPDF("trailer", "empty object treated as null"));
    } else if (object.isDictionary() && readToken(*m->file).isWord("stream")) {
        warn(damagedPDF("trailer", m->file->tell(), "stream keyword found in trailer"));
    }
    // Override last_offset so that it points to the beginning of the object we just read
    m->file->setLastOffset(offset);
    return object;
}